

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError ScanDeviceInfos(PaUtilHostApiRepresentation *hostApi,PaHostApiIndex hostApiIndex,
                       void **scanResults,int *newDeviceCount)

{
  PaError PVar1;
  
  paUtilErr_ = BuildDeviceList((PaAlsaHostApiRepresentation *)hostApi,scanResults,newDeviceCount);
  PVar1 = 0;
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'BuildDeviceList( alsaHostApi, scanResults, newDeviceCount )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4770\n"
                     );
    PVar1 = paUtilErr_;
  }
  return PVar1;
}

Assistant:

static PaError ScanDeviceInfos(struct PaUtilHostApiRepresentation *hostApi, PaHostApiIndex hostApiIndex,
                               void **scanResults, int *newDeviceCount)
{
    PaAlsaHostApiRepresentation* alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;
    PaError result = paNoError;
    PA_ENSURE(BuildDeviceList( alsaHostApi, scanResults, newDeviceCount ));

    return paNoError;

    error:
    return result;
}